

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O0

void __thiscall slang::ast::LookupResult::errorIfSelectors(LookupResult *this,ASTContext *context)

{
  bool bVar1;
  SourceLocation this_00;
  char *pcVar2;
  variant_alternative_t<1UL,_variant<const_ElementSelectSyntax_*,_MemberSelector>_> *pvVar3;
  int __c;
  long in_RDI;
  SourceRange SVar4;
  SyntaxNode *unaff_retaddr;
  variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector> *sel
  ;
  SourceRange range;
  SourceRange *in_stack_ffffffffffffffb0;
  SourceLocation in_stack_ffffffffffffffc8;
  SourceLocation in_stack_ffffffffffffffd0;
  SourceLocation SVar5;
  
  bVar1 = SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
          ::empty((SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                   *)(in_RDI + 0x18));
  if (!bVar1) {
    SourceRange::SourceRange(in_stack_ffffffffffffffb0);
    pcVar2 = (char *)0x0;
    this_00 = (SourceLocation)
              SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
              ::operator[]((SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                            *)(in_RDI + 0x18),0);
    pcVar2 = std::
             variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
             ::index((variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                      *)this_00,pcVar2,__c);
    if (pcVar2 == (char *)0x0) {
      std::
      get<0ul,slang::syntax::ElementSelectSyntax_const*,slang::ast::LookupResult::MemberSelector>
                ((variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                  *)0x64bc95);
      SVar4 = slang::syntax::SyntaxNode::sourceRange(unaff_retaddr);
      in_stack_ffffffffffffffc8 = SVar4.startLoc;
      in_stack_ffffffffffffffd0 = SVar4.endLoc;
      SVar5 = in_stack_ffffffffffffffc8;
    }
    else {
      pvVar3 = std::
               get<1ul,slang::syntax::ElementSelectSyntax_const*,slang::ast::LookupResult::MemberSelector>
                         ((variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                           *)0x64bcc7);
      SVar5 = (pvVar3->nameRange).startLoc;
    }
    SVar4.endLoc = this_00;
    SVar4.startLoc = in_stack_ffffffffffffffd0;
    ASTContext::addDiag((ASTContext *)in_stack_ffffffffffffffc8,SVar5._4_4_,SVar4);
  }
  return;
}

Assistant:

void LookupResult::errorIfSelectors(const ASTContext& context) const {
    if (selectors.empty())
        return;

    SourceRange range;
    auto& sel = selectors[0];
    if (sel.index() == 0)
        range = std::get<0>(sel)->sourceRange();
    else
        range = std::get<1>(sel).nameRange;

    context.addDiag(diag::UnexpectedSelection, range);
}